

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void emit_loop(ch_compilation *comp,ch_jmpptr offset)

{
  ch_emit_scope *pcVar1;
  int iVar2;
  ch_jmpptr real_offset;
  ch_jmpptr current;
  ch_blob *bytecode;
  undefined4 local_18;
  uint8_t le_value [4];
  ch_op op;
  ch_jmpptr offset_local;
  ch_compilation *comp_local;
  
  local_18 = 0x1e;
  le_value = (uint8_t  [4])offset;
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_18,1);
  ch_uint32_to_le_array(0,(uint8_t *)((long)&bytecode + 4));
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,(void *)((long)&bytecode + 4),4);
  pcVar1 = (comp->emit).emit_scope;
  iVar2 = (int)(pcVar1->bytecode).current - (int)(pcVar1->bytecode).start;
  ch_emit_patch_ptr(&comp->emit,-(iVar2 - (int)le_value),iVar2 + -4);
  return;
}

Assistant:

void emit_loop(ch_compilation *comp, ch_jmpptr offset) {
  EMIT_OP(GET_EMIT(comp), OP_JMP);
  EMIT_PTR(GET_EMIT(comp), 0);

  ch_blob* bytecode = &GET_EMIT(comp)->emit_scope->bytecode;
  ch_jmpptr current = CH_BLOB_CONTENT_SIZE(bytecode);
  ch_jmpptr real_offset = (current - offset);

  ch_emit_patch_ptr(GET_EMIT(comp), -real_offset, current - sizeof(ch_jmpptr));
}